

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O1

void __thiscall
Buffer_change_event_remove_ntoh_u32_Test::TestBody(Buffer_change_event_remove_ntoh_u32_Test *this)

{
  size_t sVar1;
  char *message;
  initializer_list<bfy_changed_cb_info> __l;
  AssertionResult gtest_ar;
  BufferWithReadonlyStrings local;
  allocator_type local_111;
  internal local_110 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> local_100;
  bfy_changed_cb_info local_e8;
  BufferWithReadonlyStrings local_d0;
  
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_d0);
  sVar1 = bfy_buffer_get_content_len(&local_d0.buf);
  bfy_buffer_set_changed_cb
            (&local_d0.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_d0.changes);
  bfy_buffer_remove_ntoh_u32(&local_d0.buf);
  local_e8.n_added = 0;
  local_e8.n_deleted = 4;
  __l._M_len = 1;
  __l._M_array = &local_e8;
  local_e8.orig_size = sVar1;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            (&local_100,__l,&local_111);
  testing::internal::
  CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
            (local_110,"changes_t{expected}","local.changes",&local_100,&local_d0.changes);
  if (local_100.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_108 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_108->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x624,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if (local_100.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)((local_100.
                    super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
                    _M_impl.super__Vector_impl_data._M_start)->orig_size + 8))();
    }
  }
  if (local_108 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_108,local_108);
  }
  anon_unknown.dwarf_1ff97::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_d0);
  return;
}

Assistant:

TEST(Buffer, change_event_remove_ntoh_u32) {
    BufferWithReadonlyStrings local;
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = 0,
        .n_deleted = sizeof(uint32_t)
    };

    local.start_listening_to_changes();
    bfy_buffer_remove_ntoh_u32(&local.buf);
    EXPECT_EQ(changes_t{expected}, local.changes);
}